

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

void __thiscall QToolBarAreaLayoutInfo::fitLayout(QToolBarAreaLayoutInfo *this)

{
  QToolBarAreaLayoutLine *this_00;
  long lVar1;
  bool bVar2;
  DockPosition DVar3;
  Representation RVar4;
  pointer pQVar5;
  QSize QVar6;
  DockPosition DVar7;
  QRect *pQVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lStack_60;
  
  this->dirty = false;
  DVar7 = this->dockPos & ~TopDock;
  iVar11 = 0;
  DVar3 = this->dockPos | TopDock;
  if (DVar3 == BottomDock) {
    lVar10 = (long)((int)(this->lines).d.size + -1);
  }
  else {
    lVar10 = 0;
  }
  lVar1 = (ulong)(DVar7 != RightDock) * 2 + -1;
  lVar9 = lVar10 * 0x30;
  for (; ((DVar7 != RightDock || (-1 < lVar10)) &&
         ((DVar3 == BottomDock || (lVar10 != (this->lines).d.size)))); lVar10 = lVar10 + lVar1) {
    pQVar5 = QList<QToolBarAreaLayoutLine>::data(&this->lines);
    this_00 = (QToolBarAreaLayoutLine *)((long)&(pQVar5->rect).x1.m_i + lVar9);
    bVar2 = QToolBarAreaLayoutLine::skip(this_00);
    if (!bVar2) {
      if (this->o == Horizontal) {
        *(int *)((long)&(pQVar5->rect).x1.m_i + lVar9) = (this->rect).x1.m_i;
        *(int *)((long)&(pQVar5->rect).x2.m_i + lVar9) = (this->rect).x2.m_i;
        *(int *)((long)&(pQVar5->rect).y1.m_i + lVar9) = (this->rect).y1.m_i + iVar11;
        QVar6 = QToolBarAreaLayoutLine::sizeHint(this_00);
        RVar4 = QVar6.ht.m_i;
        lStack_60 = 0xc;
        pQVar8 = (QRect *)&(this->rect).y1;
      }
      else {
        *(int *)((long)&(pQVar5->rect).y1.m_i + lVar9) = (this->rect).y1.m_i;
        *(int *)((long)&(pQVar5->rect).y2.m_i + lVar9) = (this->rect).y2.m_i;
        *(int *)((long)&(pQVar5->rect).x1.m_i + lVar9) = (this->rect).x1.m_i + iVar11;
        QVar6 = QToolBarAreaLayoutLine::sizeHint(this_00);
        RVar4 = QVar6.wd.m_i;
        lStack_60 = 8;
        pQVar8 = &this->rect;
      }
      iVar11 = iVar11 + RVar4.m_i;
      *(int *)((long)&(pQVar5->rect).x1.m_i + lVar9 + lStack_60) = (pQVar8->x1).m_i + iVar11 + -1;
      QToolBarAreaLayoutLine::fitLayout(this_00);
    }
    lVar9 = lVar9 + lVar1 * 0x30;
  }
  return;
}

Assistant:

void QToolBarAreaLayoutInfo::fitLayout()
{
    dirty = false;

    int b = 0;

    bool reverse = dockPos == QInternal::RightDock || dockPos == QInternal::BottomDock;

    int i = reverse ? lines.size() - 1 : 0;
    for (;;) {
        if ((reverse && i < 0) || (!reverse && i == lines.size()))
            break;

        QToolBarAreaLayoutLine &l = lines[i];
        if (!l.skip()) {
            if (o == Qt::Horizontal) {
                l.rect.setLeft(rect.left());
                l.rect.setRight(rect.right());
                l.rect.setTop(b + rect.top());
                b += l.sizeHint().height();
                l.rect.setBottom(b - 1 + rect.top());
            } else {
                l.rect.setTop(rect.top());
                l.rect.setBottom(rect.bottom());
                l.rect.setLeft(b + rect.left());
                b += l.sizeHint().width();
                l.rect.setRight(b - 1 + rect.left());
            }

            l.fitLayout();
        }

        i += reverse ? -1 : 1;
    }
}